

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O3

ON_Brep * ON_BrepTrimmedPlane(ON_Plane *plane,ON_SimpleArray<ON_Curve_*> *boundary,
                             bool bDuplicateCurves,ON_Brep *pBrep)

{
  bool bVar1;
  int si;
  ON_Brep *this;
  ON_PlaneSurface *this_00;
  ON_BrepFace *face;
  long lVar2;
  ON_Plane *pOVar3;
  ON_BrepLoop *pOVar4;
  byte bVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar6;
  ON_Interval extents;
  ON_Interval extents_00;
  ON_Interval extents_01;
  ON_Interval extents_02;
  
  bVar5 = 0;
  if (pBrep == (ON_Brep *)0x0) {
    this = (ON_Brep *)operator_new(0x138);
    ON_Brep::ON_Brep(this);
  }
  else {
    ON_Brep::Destroy(pBrep);
    this = pBrep;
  }
  this_00 = (ON_PlaneSurface *)operator_new(0xd0);
  ON_PlaneSurface::ON_PlaneSurface(this_00);
  pOVar3 = &this_00->m_plane;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pOVar3->origin).x = (plane->origin).x;
    plane = (ON_Plane *)((long)plane + (ulong)bVar5 * -0x10 + 8);
    pOVar3 = (ON_Plane *)((long)pOVar3 + (ulong)bVar5 * -0x10 + 8);
  }
  (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
            (0xc059000000000000,0x4059000000000000,this_00,0);
  dVar6 = 100.0;
  (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
            (0xc059000000000000,this_00);
  (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this_00);
  extents.m_t[1] = dVar6;
  extents.m_t[0] = extraout_XMM0_Qa;
  ON_PlaneSurface::SetExtents(this_00,0,extents,false);
  (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this_00,1);
  extents_00.m_t[1] = dVar6;
  extents_00.m_t[0] = extraout_XMM0_Qa_00;
  ON_PlaneSurface::SetExtents(this_00,1,extents_00,false);
  si = ON_Brep::AddSurface(this,(ON_Surface *)this_00);
  face = ON_Brep::NewFace(this,si);
  (*(face->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object._vptr_ON_Object
    [0x17])(face,1);
  bVar1 = ON_Brep::NewPlanarFaceLoop(this,face->m_face_index,outer,boundary,bDuplicateCurves);
  if (bVar1) {
    lVar2 = (long)(this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.
                  m_count;
    pOVar4 = (this->m_L).super_ON_ObjectArray<ON_BrepLoop>.super_ON_ClassArray<ON_BrepLoop>.m_a +
             lVar2 + -1;
    if (lVar2 < 1) {
      pOVar4 = (ON_BrepLoop *)0x0;
    }
    (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
              ((pOVar4->m_pbox).m_min.x,(pOVar4->m_pbox).m_max.x,this_00,0);
    dVar6 = (pOVar4->m_pbox).m_max.y;
    (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
              ((pOVar4->m_pbox).m_min.y,this_00);
    (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this_00);
    extents_01.m_t[1] = dVar6;
    extents_01.m_t[0] = extraout_XMM0_Qa_01;
    ON_PlaneSurface::SetExtents(this_00,0,extents_01,false);
    (*(this_00->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
              (this_00,1);
    extents_02.m_t[1] = dVar6;
    extents_02.m_t[0] = extraout_XMM0_Qa_02;
    ON_PlaneSurface::SetExtents(this_00,1,extents_02,false);
    ON_Brep::SetTrimIsoFlags(this,face);
  }
  else {
    if (pBrep == (ON_Brep *)0x0) {
      (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this);
    }
    else {
      ON_Brep::Destroy(pBrep);
    }
    this = (ON_Brep *)0x0;
  }
  return this;
}

Assistant:

ON_Brep* ON_BrepTrimmedPlane( 
            const ON_Plane& plane, 
            ON_SimpleArray<ON_Curve*>& boundary,
            bool bDuplicateCurves,
            ON_Brep* pBrep )
{
  ON_Brep* brep;
  if ( pBrep )
  {
    pBrep->Destroy();
    brep = pBrep;
  }
  else
    brep = new ON_Brep();

  ON_PlaneSurface* s = new ON_PlaneSurface();
  s->m_plane = plane;
  s->SetDomain(0, -100.0, 100.0 ); // any domain and extents will do for now
  s->SetDomain(1, -100.0, 100.0 );
  s->SetExtents(0, s->Domain(0) );
  s->SetExtents(1, s->Domain(1) );
  const int si = brep->AddSurface(s);
  ON_BrepFace& face = brep->NewFace( si );
  face.DestroyRuntimeCache();
  if ( brep->NewPlanarFaceLoop( face.m_face_index, ON_BrepLoop::outer, boundary, bDuplicateCurves ) )
  {
    // set face domain
    const ON_BrepLoop* loop = brep->m_L.Last();
    s->SetDomain(0, loop->m_pbox.m_min.x, loop->m_pbox.m_max.x );
    s->SetDomain(1, loop->m_pbox.m_min.y, loop->m_pbox.m_max.y );
    s->SetExtents(0,s->Domain(0));
    s->SetExtents(1,s->Domain(1));

    // need to update trim m_iso flags because we changed surface shape
    brep->SetTrimIsoFlags(face);
  }
  else
  {
    if ( pBrep )
      pBrep->Destroy();
    else
      delete brep;
    brep = nullptr;
  }
  return brep;
}